

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O3

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event::Replay
          (Event *this,AnyWriter *writer)

{
  size_t sVar1;
  StringPiece name;
  StringPiece name_00;
  StringPiece name_01;
  
  switch(this->type_) {
  case START_OBJECT:
    sVar1 = (this->name_)._M_string_length;
    name.ptr_ = (this->name_)._M_dataplus._M_p;
    name.length_ = (this->name_)._M_string_length;
    if ((long)sVar1 < 0) {
      StringPiece::LogFatalSizeTooBig(sVar1,"size_t to int conversion");
    }
    break;
  case END_OBJECT:
    EndObject(writer);
    return;
  case START_LIST:
    sVar1 = (this->name_)._M_string_length;
    name_01.ptr_ = (this->name_)._M_dataplus._M_p;
    name_01.length_ = (this->name_)._M_string_length;
    if ((long)sVar1 < 0) {
      StringPiece::LogFatalSizeTooBig(sVar1,"size_t to int conversion");
    }
    StartList(writer,name_01);
    return;
  case END_LIST:
    EndList(writer);
    return;
  case RENDER_DATA_PIECE:
    sVar1 = (this->name_)._M_string_length;
    name_00.ptr_ = (this->name_)._M_dataplus._M_p;
    name_00.length_ = (this->name_)._M_string_length;
    if ((long)sVar1 < 0) {
      StringPiece::LogFatalSizeTooBig(sVar1,"size_t to int conversion");
    }
    RenderDataPiece(writer,name_00,&this->value_);
    return;
  default:
    return;
  }
  StartObject(writer,name);
  return;
}

Assistant:

void ProtoStreamObjectWriter::AnyWriter::Event::Replay(
    AnyWriter* writer) const {
  switch (type_) {
    case START_OBJECT:
      writer->StartObject(name_);
      break;
    case END_OBJECT:
      writer->EndObject();
      break;
    case START_LIST:
      writer->StartList(name_);
      break;
    case END_LIST:
      writer->EndList();
      break;
    case RENDER_DATA_PIECE:
      writer->RenderDataPiece(name_, value_);
      break;
  }
}